

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenshtein_distance.cc
# Opt level: O3

int __thiscall StrSimilar::ldistance(StrSimilar *this,string *source,string *target)

{
  char cVar1;
  pointer piVar2;
  pointer pcVar3;
  pointer pcVar4;
  int *piVar5;
  undefined1 auVar6 [32];
  ostream *poVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long in_R9;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  size_type sVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [32];
  Tmatrix matrix;
  Logger local_8c;
  undefined1 local_88 [32];
  string local_68;
  string *local_48;
  string *local_40;
  long local_38;
  
  sVar16 = source->_M_string_length;
  if (sVar16 == 0) {
    local_88._0_8_ = local_88 + 0x10;
    local_8c.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/levenshtein_distance.cc"
               ,"");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"ldistance","");
    poVar7 = Logger::Start(ERR,(string *)local_88,0x3f,&local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/levenshtein_distance.cc"
               ,0x69);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x3f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"!source.empty()",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
    poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
    std::operator<<(poVar7,"\n");
  }
  else {
    uVar8 = target->_M_string_length;
    if (uVar8 != 0) {
      iVar12 = (int)uVar8;
      if (iVar12 != 0) {
        iVar15 = (int)sVar16;
        if (iVar15 == 0) {
          sVar16 = uVar8 & 0xffffffff;
        }
        else {
          local_38 = sVar16 << 0x20;
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)local_88,local_38 + 0x100000000 >> 0x20,(allocator_type *)&local_68);
          if (-1 < iVar15) {
            lVar14 = 0;
            uVar10 = (ulong)(iVar15 + 1);
            local_48 = source;
            local_40 = target;
            do {
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)(local_88._0_8_ + lVar14),
                         (long)((uVar8 << 0x20) + 0x100000000) >> 0x20);
              lVar14 = lVar14 + 0x18;
              uVar10 = uVar10 - 1;
            } while (uVar10 != 0);
            auVar6 = vpmovsxbd_avx2(ZEXT816(0x807060504030201));
            auVar18 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
            auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar20 = vpbroadcastq_avx512f(ZEXT816(0x18));
            auVar21 = vpbroadcastq_avx512f(ZEXT816(8));
            auVar25._8_4_ = 8;
            auVar25._0_8_ = 0x800000008;
            auVar25._12_4_ = 8;
            auVar25._16_4_ = 8;
            auVar25._20_4_ = 8;
            auVar25._24_4_ = 8;
            auVar25._28_4_ = 8;
            auVar22 = vpbroadcastq_avx512f();
            uVar8 = 0;
            do {
              auVar23 = vpbroadcastq_avx512f();
              vpmullq_avx512dq(auVar18,auVar20);
              uVar8 = uVar8 + 8;
              auVar18 = vpaddq_avx512f(auVar18,auVar21);
              auVar23 = vporq_avx512f(auVar23,auVar19);
              uVar10 = vpcmpuq_avx512f(auVar23,auVar22,2);
              auVar23 = vpgatherqq_avx512f(*(undefined8 *)(local_88._0_8_ + in_R9));
              auVar17._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * auVar23._8_8_;
              auVar17._0_8_ = (ulong)((byte)uVar10 & 1) * auVar23._0_8_;
              auVar17._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * auVar23._16_8_;
              auVar17._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * auVar23._24_8_;
              vpscatterqd_avx512f(ZEXT832(0) + auVar17,uVar10,auVar6);
              auVar6 = vpaddd_avx2(auVar6,auVar25);
              source = local_48;
              target = local_40;
            } while (((ulong)(iVar15 + 1) + 6 & 0x1fffffff8) != uVar8);
          }
          if (0 < iVar12) {
            auVar18 = vpmovsxbd_avx512f(_DAT_0019611c);
            auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar21 = vpbroadcastd_avx512f(ZEXT416(0x10));
            piVar2 = (((pointer)local_88._0_8_)->super__Vector_base<int,_std::allocator<int>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            auVar22 = vpbroadcastq_avx512f();
            uVar8 = 0;
            do {
              auVar23 = vpbroadcastq_avx512f();
              auVar24 = vporq_avx512f(auVar23,auVar19);
              auVar23 = vporq_avx512f(auVar23,auVar20);
              vpcmpuq_avx512f(auVar23,auVar22,2);
              vpcmpuq_avx512f(auVar24,auVar22,2);
              auVar23 = vmovdqu32_avx512f(auVar18);
              *(undefined1 (*) [64])(piVar2 + uVar8 + 1) = auVar23;
              uVar8 = uVar8 + 0x10;
              auVar18 = vpaddd_avx512f(auVar18,auVar21);
            } while (((ulong)(iVar12 + 1) + 0xe & 0x1fffffff0) != uVar8);
          }
          if (-1 < iVar15) {
            pcVar3 = (source->_M_dataplus)._M_p;
            pcVar4 = (target->_M_dataplus)._M_p;
            uVar8 = 1;
            do {
              if (0 < iVar12) {
                cVar1 = pcVar3[uVar8 - 1];
                lVar14 = 0;
                piVar5 = (((pointer)(local_88._0_8_ + uVar8 * 0x18))->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                piVar2 = (((pointer)(local_88._0_8_ + (uVar8 - 1) * 0x18))->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                iVar9 = *piVar5;
                do {
                  iVar13 = (uint)(cVar1 != pcVar4[lVar14]) + piVar2[lVar14];
                  iVar11 = piVar2[lVar14 + 1] + 1;
                  if (iVar9 + 1 < iVar13) {
                    iVar13 = iVar9 + 1;
                  }
                  iVar9 = iVar11;
                  if (iVar13 <= iVar11) {
                    iVar9 = iVar13;
                  }
                  piVar5[lVar14 + 1] = iVar9;
                  lVar14 = lVar14 + 1;
                } while ((ulong)(iVar12 + 1) - 1 != lVar14);
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 != iVar15 + 1);
          }
          sVar16 = (size_type)
                   (uint)(((pointer)(local_88._0_8_ + (local_38 >> 0x20) * 0x18))->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[iVar12];
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)local_88);
        }
      }
      return (int)sVar16;
    }
    local_88._0_8_ = local_88 + 0x10;
    local_8c.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/levenshtein_distance.cc"
               ,"");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"ldistance","");
    poVar7 = Logger::Start(ERR,(string *)local_88,0x40,&local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/levenshtein_distance.cc"
               ,0x69);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"!target.empty()",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
    poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
    std::operator<<(poVar7,"\n");
  }
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)local_88);
  Logger::~Logger(&local_8c);
  abort();
}

Assistant:

int StrSimilar::ldistance(const std::string& source,
                          const std::string& target) {
  CHECK(!source.empty());
  CHECK(!target.empty());
  //step 1
  int n = source.length();
  int m = target.length();
  if (m == 0) return n;
  if (n == 0) return m;
  //Construct a matrix
  typedef std::vector<std::vector<int> >  Tmatrix;
  Tmatrix matrix(n + 1);
  for (int i = 0; i <= n; i++)  { matrix[i].resize(m + 1); }
  //step 2 Initialize
  for (int i = 1; i <= n; i++) { matrix[i][0] = i; }
  for (int i = 1; i <= m; i++) { matrix[0][i] = i; }
  //step 3
  for (int i = 1; i <= n; i++) {
    const char si = source[i - 1];
    //step 4
    for (int j = 1; j <= m; j++) {
      const char dj = target[j - 1];
      //step 5
      int cost;
      if (si == dj) { cost = 0; }
      else { cost = 1; }
      //step 6
      const int above = matrix[i - 1][j] + 1;
      const int left = matrix[i][j - 1] + 1;
      const int diag = matrix[i - 1][j - 1] + cost;
      matrix[i][j] = min(above, min(left, diag));
     }
  }
  //step 7
  return matrix[n][m];
}